

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaAttributeGroupExpandRefs
              (xmlSchemaParserCtxtPtr pctxt,xmlSchemaAttributeGroupPtr_conflict attrGr)

{
  int iVar1;
  
  iVar1 = 0;
  if (((xmlSchemaItemListPtr)attrGr->attrUses != (xmlSchemaItemListPtr)0x0) &&
     ((attrGr->flags & 1U) == 0)) {
    attrGr->flags = attrGr->flags | 1;
    iVar1 = xmlSchemaExpandAttributeGroupRefs
                      (pctxt,(xmlSchemaBasicItemPtr)attrGr,&attrGr->attributeWildcard,
                       (xmlSchemaItemListPtr)attrGr->attrUses,(xmlSchemaItemListPtr)0x0);
    iVar1 = -(uint)(iVar1 == -1);
  }
  return iVar1;
}

Assistant:

static int
xmlSchemaAttributeGroupExpandRefs(xmlSchemaParserCtxtPtr pctxt,
				  xmlSchemaAttributeGroupPtr attrGr)
{
    if ((attrGr->attrUses == NULL) ||
	(attrGr->flags & XML_SCHEMAS_ATTRGROUP_WILDCARD_BUILDED))
	return(0);

    attrGr->flags |= XML_SCHEMAS_ATTRGROUP_WILDCARD_BUILDED;
    if (xmlSchemaExpandAttributeGroupRefs(pctxt, WXS_BASIC_CAST attrGr,
	&(attrGr->attributeWildcard), attrGr->attrUses, NULL) == -1)
	return(-1);
    return(0);
}